

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O3

int32 __thiscall nuraft::buffer::get_int(buffer *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  overflow_error *this_00;
  uint uVar4;
  long lVar5;
  buffer *pbVar6;
  
  uVar1 = *(uint *)this;
  uVar2 = 0x7fffffff;
  if (-1 < (int)uVar1) {
    uVar2 = 0xffff;
  }
  uVar4 = uVar1 >> 0x10;
  if ((int)uVar1 < 0) {
    uVar4 = *(uint *)(this + 4);
    lVar5 = 8;
  }
  else {
    lVar5 = 4;
  }
  if (3 < (ulong)(uVar2 & uVar1) - (ulong)uVar4) {
    pbVar6 = this + (ulong)uVar4 + lVar5;
    lVar5 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + ((uint)(byte)*pbVar6 << ((byte)lVar5 & 0x1f));
      lVar5 = lVar5 + 8;
      pbVar6 = pbVar6 + 1;
    } while (lVar5 != 0x20);
    if ((int)uVar1 < 0) {
      *(int *)(this + 4) = *(int *)(this + 4) + 4;
    }
    else {
      *(short *)(this + 2) = (short)(uVar1 >> 0x10) + 4;
    }
    return iVar3;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"insufficient buffer available for an int32 value");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

size_t buffer::size() const {
    return (size_t)( __size_of_block(this) );
}